

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::verify
          (AsyncCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  _Base_ptr p_Var2;
  int iVar3;
  int iVar4;
  _Self __tmp;
  _Rb_tree_header *p_Var5;
  ScopedLock lock;
  VerificationResult result;
  Mutex *pMVar6;
  VerificationResult local_1f8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar1 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  pMVar6 = &this->m_mutex;
  deMutex_lock((this->m_mutex).m_mutex);
  p_Var2 = (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->m_counts)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var5) {
    iVar4 = 0;
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    iVar4 = 0;
    do {
      BaseCase::verifyMessageCount
                (&local_1f8,(BaseCase *)(p_Var2 + 1),(MessageID *)0x1100,
                 *(GLenum *)&p_Var2[1]._M_left,*(int *)((long)&p_Var2[1]._M_parent + 4),1,
                 SUB81(pMVar6,0));
      if ((char)ctx != '\0') {
        local_1b0._0_8_ = pTVar1;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_1f8.logMessage._M_dataplus._M_p,
                   local_1f8.logMessage._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
      }
      iVar3 = iVar4;
      if (iVar4 == 0) {
        iVar3 = 1;
      }
      if (local_1f8.result != QP_TEST_RESULT_PASS) {
        iVar4 = iVar3;
      }
      if (local_1f8.result == QP_TEST_RESULT_FAIL) {
        iVar4 = 2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.logMessage._M_dataplus._M_p != &local_1f8.logMessage.field_2) {
        operator_delete(local_1f8.logMessage._M_dataplus._M_p,
                        local_1f8.logMessage.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.resultMessage._M_dataplus._M_p != &local_1f8.resultMessage.field_2) {
        operator_delete(local_1f8.resultMessage._M_dataplus._M_p,
                        local_1f8.resultMessage.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var5);
  }
  deMutex_unlock(pMVar6->m_mutex);
  return iVar4;
}

Assistant:

AsyncCase::VerifyState AsyncCase::verify (bool uselog)
{
	using std::map;

	VerifyState			retval		= VERIFY_PASS;
	TestLog&			log			= m_testCtx.getLog();

	const de::ScopedLock lock(m_mutex);

	for (map<MessageID, MessageCount>::const_iterator itr = m_counts.begin(); itr != m_counts.end(); itr++)
	{
		const MessageID&	id			= itr->first;

		const int			refCount	= itr->second.expected;
		const int			resCount	= itr->second.received;
		const bool			enabled		= true;

		VerificationResult	result		= verifyMessageCount(id, GL_DONT_CARE, refCount, resCount, enabled);

		if (uselog)
			log << TestLog::Message << result.logMessage << TestLog::EndMessage;

		if (result.result == QP_TEST_RESULT_FAIL)
			retval = VERIFY_FAIL;
		else if (result.result != QP_TEST_RESULT_PASS && retval == VERIFY_PASS)
			retval = VERIFY_MINIMUM;
	}

	return retval;
}